

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimeprovider.cpp
# Opt level: O0

void __thiscall
QMimeBinaryProvider::addAllMimeTypes(QMimeBinaryProvider *this,QList<QMimeType> *result)

{
  bool bVar1;
  byte bVar2;
  const_iterator o;
  QMimeTypePrivate *in_RSI;
  QList<QMimeType> *in_RDI;
  long in_FS_OFFSET;
  QString *name_1;
  add_const_t<QSet<QString>_> *__range2_1;
  QString *name;
  add_const_t<QSet<QString>_> *__range2;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  const_iterator __end2;
  const_iterator __begin2;
  QString *in_stack_fffffffffffffe98;
  QMimeTypePrivate *in_stack_fffffffffffffea0;
  QMimeTypePrivate *in_stack_fffffffffffffea8;
  QMimeTypePrivate *dd;
  QMimeType *in_stack_fffffffffffffeb0;
  QMimeType *this_00;
  undefined7 in_stack_fffffffffffffeb8;
  undefined1 in_stack_fffffffffffffebf;
  anon_class_24_1_898f2789_for__M_pred *in_stack_fffffffffffffed0;
  QMimeBinaryProvider *in_stack_fffffffffffffef0;
  const_iterator in_stack_ffffffffffffff20;
  const_iterator in_stack_ffffffffffffff28;
  QMimeType local_b8 [8];
  const_iterator local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  undefined1 *local_58;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  loadMimeTypeList(in_stack_fffffffffffffef0);
  bVar1 = QList<QMimeType>::isEmpty((QList<QMimeType> *)0x8fb1bb);
  if (bVar1) {
    QSet<QString>::size((QSet<QString> *)0x8fb1df);
    QList<QMimeType>::reserve(in_RDI,(qsizetype)in_stack_ffffffffffffff28.i);
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    QSet<QString>::begin
              ((QSet<QString> *)CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8));
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    QSet<QString>::end((QSet<QString> *)
                       CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8));
    while (bVar1 = QSet<QString>::const_iterator::operator!=
                             ((const_iterator *)in_stack_fffffffffffffea0,
                              (const_iterator *)in_stack_fffffffffffffe98), bVar1) {
      QSet<QString>::const_iterator::operator*((const_iterator *)0x8fb2b2);
      QMimeTypePrivate::QMimeTypePrivate(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
      QMimeType::QMimeType(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
      QList<QMimeType>::append
                ((QList<QMimeType> *)in_stack_fffffffffffffea0,(rvalue_ref)in_stack_fffffffffffffe98
                );
      QMimeType::~QMimeType((QMimeType *)0x8fb316);
      QMimeTypePrivate::~QMimeTypePrivate((QMimeTypePrivate *)0x8fb323);
      QSet<QString>::const_iterator::operator++((const_iterator *)in_stack_fffffffffffffea0);
    }
  }
  else {
    local_60 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    QSet<QString>::begin
              ((QSet<QString> *)CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8));
    local_70 = &DAT_aaaaaaaaaaaaaaaa;
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    QSet<QString>::end((QSet<QString> *)
                       CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8));
    while (bVar1 = QSet<QString>::const_iterator::operator!=
                             ((const_iterator *)in_stack_fffffffffffffea0,
                              (const_iterator *)in_stack_fffffffffffffe98), bVar1) {
      QSet<QString>::const_iterator::operator*((const_iterator *)0x8fb442);
      QList<QMimeType>::constBegin((QList<QMimeType> *)in_stack_fffffffffffffea0);
      QList<QMimeType>::constEnd((QList<QMimeType> *)in_stack_fffffffffffffea0);
      QString::QString((QString *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
      local_78 = std::
                 find_if<QList<QMimeType>::const_iterator,QMimeBinaryProvider::addAllMimeTypes(QList<QMimeType>&)::__0>
                           (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                            in_stack_fffffffffffffed0);
      o = QList<QMimeType>::constEnd((QList<QMimeType> *)in_stack_fffffffffffffea0);
      bVar2 = QList<QMimeType>::const_iterator::operator==(&local_78,o);
      addAllMimeTypes(QList<QMimeType>&)::$_0::~__0
                ((anon_class_24_1_898f2789_for__M_pred *)0x8fb4e1);
      if ((bVar2 & 1) != 0) {
        this_00 = local_b8;
        dd = in_RSI;
        QMimeTypePrivate::QMimeTypePrivate(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
        QMimeType::QMimeType(this_00,dd);
        QList<QMimeType>::append
                  ((QList<QMimeType> *)in_stack_fffffffffffffea0,
                   (rvalue_ref)in_stack_fffffffffffffe98);
        QMimeType::~QMimeType((QMimeType *)0x8fb547);
        QMimeTypePrivate::~QMimeTypePrivate((QMimeTypePrivate *)0x8fb554);
      }
      QSet<QString>::const_iterator::operator++((const_iterator *)in_stack_fffffffffffffea0);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMimeBinaryProvider::addAllMimeTypes(QList<QMimeType> &result)
{
    loadMimeTypeList();
    if (result.isEmpty()) {
        result.reserve(m_mimetypeNames.size());
        for (const QString &name : std::as_const(m_mimetypeNames))
            result.append(QMimeType(QMimeTypePrivate(name)));
    } else {
        for (const QString &name : std::as_const(m_mimetypeNames))
            if (std::find_if(result.constBegin(), result.constEnd(), [name](const QMimeType &mime) -> bool { return mime.name() == name; })
                    == result.constEnd())
                result.append(QMimeType(QMimeTypePrivate(name)));
    }
}